

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O1

int __thiscall
boost::deflate::deflate_stream_test::BoostCompressor::init(BoostCompressor *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  int in_ECX;
  int in_EDX;
  Strategy in_R8D;
  
  (this->zp).avail_out = 0;
  (this->zp).total_out = 0;
  (this->zp).total_in = 0;
  (this->zp).next_out = (void *)0x0;
  (this->zp).next_in = (void *)0x0;
  (this->zp).avail_in = 0;
  (this->zp).data_type = 2;
  (this->zp).check = 0;
  detail::deflate_stream::doClear(&(this->ds).super_deflate_stream);
  if (3 < in_R8D - filtered) {
    in_R8D = normal;
  }
  detail::deflate_stream::doReset
            (&(this->ds).super_deflate_stream,(int)ctx,in_EDX,in_ECX,in_R8D,none);
  return extraout_EAX;
}

Assistant:

void init(
            int level,
            int windowBits,
            int memLevel,
            int strategy) override
        {
            zp = {};
            ds.clear();
            ds.reset(
                level,
                windowBits,
                memLevel,
                toStrategy(strategy));
        }